

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

UniValue * __thiscall
CRPCConvertTable::ArgToUniValue
          (UniValue *__return_storage_ptr__,CRPCConvertTable *this,string_view arg_value,
          string *method,int param_idx)

{
  size_type sVar1;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  key_type local_60;
  long local_38;
  
  local_70._M_str = arg_value._M_str;
  local_70._M_len = arg_value._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string((string *)&local_60,method);
  local_60.second = param_idx;
  sVar1 = std::
          set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::count(&this->members,&local_60);
  if (sVar1 == 0) {
    UniValue::
    UniValue<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_70);
  }
  else {
    Parse(__return_storage_ptr__,arg_value);
  }
  std::__cxx11::string::~string((string *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ArgToUniValue(std::string_view arg_value, const std::string& method, int param_idx)
    {
        return members.count({method, param_idx}) > 0 ? Parse(arg_value) : arg_value;
    }